

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O1

void __thiscall cppcms::http::file::save_to(file *this,string *filename)

{
  impl_data *piVar1;
  int iVar2;
  int __fd;
  char *__new;
  pointer pcVar3;
  file *pfVar4;
  file *local_48 [2];
  
  piVar1 = (this->d).ptr_;
  std::ios::clear((int)piVar1 + 0xf8 + (int)*(undefined8 *)(*(long *)&piVar1->in + -0x18));
  std::istream::seekg(&((this->d).ptr_)->in,0,0);
  pfVar4 = (file *)(this->d).ptr_;
  (**(code **)(*(long *)&pfVar4->name_ + 0x30))();
  piVar1 = (this->d).ptr_;
  if ((piVar1->fb).in_memory_ == true) {
    save_by_copy(pfVar4,filename,&piVar1->in);
    return;
  }
  pcVar3 = (piVar1->fb).name_._M_dataplus._M_p;
  local_48[0] = (file *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar3,pcVar3 + (piVar1->fb).name_._M_string_length);
  __new = (filename->_M_dataplus)._M_p;
  iVar2 = rename((char *)local_48[0],__new);
  __fd = (int)__new;
  pfVar4 = local_48[0];
  if (local_48[0] != (file *)&stack0xffffffffffffffc8) {
    operator_delete(local_48[0]);
  }
  if (iVar2 != 0) {
    save_by_copy(pfVar4,filename,&((this->d).ptr_)->in);
    piVar1 = (this->d).ptr_;
    pcVar3 = (piVar1->fb).name_._M_dataplus._M_p;
    local_48[0] = (file *)&stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar3,pcVar3 + (piVar1->fb).name_._M_string_length);
    __fd = (int)pcVar3;
    remove((char *)local_48[0]);
    if (local_48[0] != (file *)&stack0xffffffffffffffc8) {
      operator_delete(local_48[0]);
    }
  }
  impl::file_buffer::close(&((this->d).ptr_)->fb,__fd);
  this->field_0x440 = this->field_0x440 | 1;
  return;
}

Assistant:

void file::save_to(std::string const &filename)
{
	d->in.clear(); 
	d->in.seekg(0);
	d->fb.pubsync();

	if(d->fb.in_memory()) {
		save_by_copy(filename,d->in);
		return;
	}
	#ifdef CPPCMS_WIN32
		d->fb.close();
		/// we can't move opened file on windows as it would be locked 
		if(booster::nowide::rename(d->fb.name().c_str(),filename.c_str())!=0) {
			booster::nowide::ifstream tmp(d->fb.name().c_str(),std::ios_base::binary | std::ios_base::in);
			if(!tmp) {
				throw cppcms_error("Failed to reopen file");
			}
			save_by_copy(filename,tmp);
			tmp.close();
			booster::nowide::remove(d->fb.name().c_str());
		}
	#else
		if(booster::nowide::rename(d->fb.name().c_str(),filename.c_str())!=0) {
			save_by_copy(filename,d->in);
			booster::nowide::remove(d->fb.name().c_str());
		}
		d->fb.close();
	#endif
	removed_ = 1;
}